

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.h
# Opt level: O3

void __thiscall ImFontConfig::ImFontConfig(ImFontConfig *this)

{
  undefined1 auVar1 [32];
  
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  this->FontData = (void *)auVar1._0_8_;
  this->FontDataSize = auVar1._8_4_;
  this->FontDataOwnedByAtlas = (bool)auVar1[0xc];
  *(int3 *)&this->field_0xd = auVar1._13_3_;
  this->FontNo = auVar1._16_4_;
  this->SizePixels = (float)auVar1._20_4_;
  this->OversampleH = auVar1._24_4_;
  this->OversampleV = auVar1._28_4_;
  this->GlyphMinAdvanceX = (float)auVar1._0_4_;
  this->GlyphMaxAdvanceX = (float)auVar1._4_4_;
  this->MergeMode = (bool)auVar1[8];
  *(int3 *)&this->field_0x49 = auVar1._9_3_;
  this->FontBuilderFlags = auVar1._12_4_;
  this->RasterizerMultiply = (float)auVar1._16_4_;
  this->EllipsisChar = auVar1._20_2_;
  this->Name[0] = auVar1[0x16];
  this->Name[1] = auVar1[0x17];
  this->Name[2] = auVar1[0x18];
  this->Name[3] = auVar1[0x19];
  this->Name[4] = auVar1[0x1a];
  this->Name[5] = auVar1[0x1b];
  this->Name[6] = auVar1[0x1c];
  this->Name[7] = auVar1[0x1d];
  this->Name[8] = auVar1[0x1e];
  this->Name[9] = auVar1[0x1f];
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  *(undefined1 (*) [32])(this->Name + 10) = auVar1;
  this->PixelSnapH = (bool)auVar1[0];
  *(int3 *)&this->field_0x21 = auVar1._1_3_;
  (this->GlyphExtraSpacing).x = (float)(int)auVar1._4_8_;
  (this->GlyphExtraSpacing).y = (float)(int)((ulong)auVar1._4_8_ >> 0x20);
  (this->GlyphOffset).x = (float)(int)auVar1._12_8_;
  (this->GlyphOffset).y = (float)(int)((ulong)auVar1._12_8_ >> 0x20);
  *(int *)&this->field_0x34 = auVar1._20_4_;
  this->GlyphRanges = (ImWchar *)auVar1._24_8_;
  this->DstFont = (ImFont *)0x0;
  this->FontDataOwnedByAtlas = true;
  this->OversampleH = 3;
  this->OversampleV = 1;
  this->GlyphMaxAdvanceX = 3.4028235e+38;
  this->RasterizerMultiply = 1.0;
  this->EllipsisChar = 0xffff;
  return;
}

Assistant:

ImVec2()                                { x = y = 0.0f; }